

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

void __thiscall Net::fit(Net *this,Table *samp,Table *ans,int global_iterations,int shott)

{
  Table *this_00;
  pointer pvVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int iVar2;
  int iVar3;
  long lVar4;
  int i;
  char *pcVar5;
  double dVar6;
  double dVar7;
  mt19937 rnd;
  
  this->shot = shott;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rnd,0x4b);
  iVar2 = Table::get_cols(ans);
  if (iVar2 == 1) {
    iVar2 = Table::get_cols(samp);
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)*(pointer *)
               ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + 8) -
        *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data >> 3 == (long)iVar2) {
      iVar2 = 0;
      dVar6 = Table::get_max(ans,0);
      dVar7 = Table::get_min(ans,0);
      pvVar1 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((dVar6 - dVar7) + 1.0) ==
          (int)((ulong)((long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
        this_00 = &this->samples;
        Table::operator=(this_00,samp);
        Table::operator=(&this->answers,ans);
        while( true ) {
          iVar3 = Table::get_cols(this_00);
          if (iVar3 <= iVar2) break;
          dVar6 = Table::get_max(this_00,iVar2);
          if (dVar6 <= 1.0) {
            dVar6 = 1.0;
          }
          Table::divide_column(this_00,iVar2,dVar6);
          iVar2 = iVar2 + 1;
        }
        iVar2 = Table::get_rows(this_00);
        std::vector<int,_std::allocator<int>_>::resize(&this->shuffler,(long)iVar2);
        __first._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        __last._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        for (lVar4 = 0; (long)__last._M_current - (long)__first._M_current >> 2 != lVar4;
            lVar4 = lVar4 + 1) {
          __first._M_current[lVar4] = (int)lVar4;
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                  (__first,__last,&rnd);
        if (this->shot == 0) {
          dVar6 = log((double)(int)((ulong)((long)(this->shuffler).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->shuffler).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          iVar2 = 2;
          if (2 < (int)dVar6 / 10) {
            iVar2 = (int)dVar6 / 10;
          }
          this->shot = iVar2;
        }
        learn(this,global_iterations);
        return;
      }
      pcVar5 = "Incorrect output data\n";
    }
    else {
      pcVar5 = "Incorrect input data\n";
    }
  }
  else {
    pcVar5 = "Output table has more than 1 column\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
  exit(1);
}

Assistant:

void Net::fit(Table &samp, Table &ans, int global_iterations, int shott){
    shot = shott;
    std::mt19937 rnd(75);
    if (ans.get_cols() != 1){
        std::cerr << "Output table has more than 1 column\n";
        exit(EXIT_FAILURE);
    }
    if (samp.get_cols() != mesh[0].size()){
        std::cerr << "Incorrect input data\n";
        exit(EXIT_FAILURE);
    }
    if ((int)(ans.get_max(0)-ans.get_min(0) + 1) != (int)mesh.back().size()){
        std::cerr << "Incorrect output data\n";
        exit(EXIT_FAILURE);
    }

    samples = samp;
    answers = ans;
    for (int i = 0; i < samples.get_cols(); ++i)
        samples.divide_column(i, std::max(1.0, samples.get_max(i)));

    // creating shuffler
    shuffler.resize(samples.get_rows());
    for (int i = 0; i < shuffler.size(); ++i)
        shuffler[i] = i;
    std::shuffle(shuffler.begin(), shuffler.end(), rnd);
    if (shot == 0) shot = std::max((int)log((int)shuffler.size())/10, 2);
    learn(global_iterations);
}